

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_plt_char_int(char *char_string,REF_INT max,REF_INT *n,REF_INT *int_string)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  *n = 0;
  uVar3 = 0;
  uVar2 = (ulong)(uint)max;
  if (max < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      return 7;
    }
    int_string[uVar3] = (int)char_string[uVar3];
    *n = *n + 1;
    piVar1 = int_string + uVar3;
    uVar3 = uVar3 + 1;
  } while (*piVar1 != 0);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_gather_plt_char_int(const char *char_string, REF_INT max,
                                           REF_INT *n, REF_INT *int_string) {
  REF_INT i;
  *n = 0;
  for (i = 0; i < max; i++) {
    int_string[i] = (REF_INT)char_string[i];
    (*n)++;
    if (0 == int_string[i]) return REF_SUCCESS;
  }
  return REF_INCREASE_LIMIT;
}